

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

string * GetAutogenTargetDir_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *target)

{
  cmMakefile *this;
  char *pcVar1;
  string sStack_38;
  
  this = target->Target->Makefile;
  pcVar1 = cmMakefile::GetCurrentBinaryDirectory(this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&sStack_38);
  cmMakefile::GetCMakeInstance(this);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetAutogenTargetName_abi_cxx11_(&sStack_38,target);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetAutogenTargetDir(
    cmGeneratorTarget const* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();
  std::string targetDir = makefile->GetCurrentBinaryDirectory();
  targetDir += makefile->GetCMakeInstance()->GetCMakeFilesDirectory();
  targetDir += "/";
  targetDir += GetAutogenTargetName(target);
  targetDir += ".dir/";
  return targetDir;
}